

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

int __thiscall
glcts::TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::init
          (vertexArrayObjectDefinition *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  bool bVar2;
  GLenum GVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar4;
  int extraout_EAX_01;
  undefined4 *in_RCX;
  long in_RDX;
  attributeDefinition *attribute;
  int iVar5;
  ulong uVar6;
  bufferCollection *in_R8;
  GLuint in_R9D;
  attributeDefinition *attribute_00;
  
  this->m_gl = (Functions *)ctx;
  (**(code **)(ctx + 0x708))(1,&this->m_vertex_array_object_id);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"Failed to generate VAO.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x13d0);
  (*this->m_gl->bindVertexArray)(this->m_vertex_array_object_id);
  GVar3 = (*this->m_gl->getError)();
  glu::checkError(GVar3,"Failed to bind VAO.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                  ,0x13d3);
  iVar1 = *(int *)(in_RDX + 0x20);
  attribute_00 = (attributeDefinition *)0x0;
  attribute = getAttributes::depth_attributes;
  if (iVar1 != 3) {
    attribute = attribute_00;
  }
  switch(*in_RCX) {
  case 0:
    iVar5 = 1;
    bVar2 = true;
    attribute_00 = getAttributes::texture_attributes;
    break;
  case 1:
    iVar5 = 2;
    bVar2 = true;
    attribute_00 = getAttributes::textureLod_attributes;
    break;
  case 2:
    iVar5 = 3;
    bVar2 = true;
    attribute_00 = getAttributes::textureGrad_attributes;
    break;
  case 3:
    iVar5 = 1;
    bVar2 = true;
    attribute_00 = getAttributes::textureGather_attributes;
    break;
  default:
    bVar2 = false;
    iVar5 = 0;
  }
  setupAttribute(this,(attributeDefinition *)&DAT_0215b388,in_R8,in_R9D);
  iVar4 = extraout_EAX;
  if (bVar2) {
    uVar6 = (ulong)(iVar5 + (uint)(iVar5 == 0));
    do {
      setupAttribute(this,attribute_00,in_R8,in_R9D);
      attribute_00 = attribute_00 + 1;
      uVar6 = uVar6 - 1;
      iVar4 = extraout_EAX_00;
    } while (uVar6 != 0);
  }
  if (iVar1 != 3) {
    return iVar4;
  }
  setupAttribute(this,attribute,in_R8,in_R9D);
  return extraout_EAX_01;
}

Assistant:

void TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::init(const glw::Functions&   gl,
																		const formatDefinition& format,
																		const samplingFunction& sampling_function,
																		const bufferCollection& buffers,
																		glw::GLuint				program_id)
{
	m_gl = &gl;

	m_gl->genVertexArrays(1, &m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to generate VAO.");

	m_gl->bindVertexArray(m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "Failed to bind VAO.");

	attributeDefinition		   positionAttribute = { vertex_shader_position, type_vec4, Position, 0 };
	const attributeDefinition* format_attributes;
	glw::GLuint				   n_format_attributes;
	const attributeDefinition* routine_attributes   = 0;
	glw::GLuint				   n_routine_attributes = 0;

	getAttributes(format.m_sampler_type, format_attributes, n_format_attributes);
	getAttributes(sampling_function, routine_attributes, n_routine_attributes);

	setupAttribute(positionAttribute, buffers, program_id);

	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		setupAttribute(routine_attributes[i], buffers, program_id);
	}

	for (glw::GLuint i = 0; i < n_format_attributes; ++i)
	{
		setupAttribute(format_attributes[i], buffers, program_id);
	}
}